

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::yml::anon_unknown_0::count_following_newlines(csubstr r,size_t *i,size_t indentation)

{
  ulong uVar1;
  Location loc;
  Location loc_00;
  bool bVar2;
  error_flags eVar3;
  long in_RCX;
  ulong *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t stop;
  size_t numnl_following;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  Location *in_stack_ffffffffffffff40;
  size_t local_a0;
  size_t sStack_98;
  char *local_90;
  Location *pLStack_88;
  char (*in_stack_ffffffffffffff80) [28];
  undefined8 in_stack_ffffffffffffff90;
  size_t sVar4;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Location *in_stack_ffffffffffffffb0;
  long local_30;
  ulong local_28;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  local_10 = *in_RDX;
  local_8 = &local_30;
  local_30 = in_RDI;
  local_28 = in_RSI;
  if (in_RSI <= local_10) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_18 = 0x14c3;
    handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
  }
  if (*(char *)(local_30 + local_10) != '\n') {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30
                       ,in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff40 = in_stack_ffffffffffffffb0;
    in_stack_ffffffffffffff38 = in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffff30 = in_stack_ffffffffffffffa0;
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffff98;
    loc.super_LineCol.line = in_stack_ffffffffffffff28;
    loc.super_LineCol.offset = in_stack_ffffffffffffff90;
    loc.super_LineCol.col = in_stack_ffffffffffffff30;
    loc.name.str = in_stack_ffffffffffffff38;
    loc.name.len = (size_t)in_stack_ffffffffffffff40;
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff28;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff30;
    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff38;
    in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff40;
    error<28ul>(in_stack_ffffffffffffff80,loc);
  }
  sVar4 = 0;
  *in_RDX = *in_RDX + 1;
  do {
    if (local_28 <= *in_RDX) {
      return sVar4;
    }
    if (*(char *)(local_30 + *in_RDX) == '\n') {
      sVar4 = sVar4 + 1;
      if (in_RCX != 0) {
        uVar1 = *in_RDX;
        while ((*in_RDX < local_28 &&
               ((*(char *)(local_30 + *in_RDX) == ' ' || (*(char *)(local_30 + *in_RDX) == '\r')))))
        {
          if (uVar1 + in_RCX <= *in_RDX) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            Location::Location(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            loc_00.super_LineCol.line = in_stack_ffffffffffffff98;
            loc_00.super_LineCol.offset = sVar4;
            loc_00.super_LineCol.col = in_stack_ffffffffffffffa0;
            loc_00.name.str = in_stack_ffffffffffffffa8;
            loc_00.name.len = (size_t)in_stack_ffffffffffffffb0;
            in_stack_ffffffffffffff28 = local_a0;
            in_stack_ffffffffffffff30 = sStack_98;
            in_stack_ffffffffffffff38 = local_90;
            in_stack_ffffffffffffff40 = pLStack_88;
            error<24ul>((char (*) [24])in_stack_ffffffffffffff80,loc_00);
          }
          *in_RDX = *in_RDX + 1;
        }
      }
    }
    else if (((*(char *)(local_30 + *in_RDX) != ' ') && (*(char *)(local_30 + *in_RDX) != '\t')) &&
            (*(char *)(local_30 + *in_RDX) != '\r')) {
      return sVar4;
    }
    *in_RDX = *in_RDX + 1;
  } while( true );
}

Assistant:

size_t count_following_newlines(csubstr r, size_t *C4_RESTRICT i, size_t indentation)
{
    RYML_ASSERT(r[*i] == '\n');
    size_t numnl_following = 0;
    ++(*i);
    for( ; *i < r.len; ++(*i))
    {
        if(r.str[*i] == '\n')
        {
            ++numnl_following;
            if(indentation) // skip the indentation after the newline
            {
                size_t stop = *i + indentation;
                for( ; *i < r.len; ++(*i))
                {
                    if(r.str[*i] != ' ' && r.str[*i] != '\r')
                        break;
                    RYML_ASSERT(*i < stop);
                }
                C4_UNUSED(stop);
            }
        }
        else if(r.str[*i] == ' ' || r.str[*i] == '\t' || r.str[*i] == '\r')  // skip leading whitespace
            ;
        else
            break;
    }
    return numnl_following;
}